

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_replace.h
# Opt level: O2

string * __thiscall
absl::lts_20250127::
StrReplaceAll<std::initializer_list<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
          (string *__return_storage_ptr__,lts_20250127 *this,string_view s,
          initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *replacements)

{
  string_view s_00;
  vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  subs;
  _Vector_base<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  local_30;
  
  strings_internal::
  FindSubstitutions<std::initializer_list<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
            ((vector<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
              *)&local_30,(strings_internal *)this,s,replacements);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  s_00._M_str = (char *)&local_30;
  s_00._M_len = s._M_len;
  strings_internal::ApplySubstitutions
            ((strings_internal *)this,s_00,
             (Nonnull<std::vector<strings_internal::ViableSubstitution>_*>)__return_storage_ptr__,
             (Nonnull<std::string_*>)replacements);
  std::
  _Vector_base<absl::lts_20250127::strings_internal::ViableSubstitution,_std::allocator<absl::lts_20250127::strings_internal::ViableSubstitution>_>
  ::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StrReplaceAll(absl::string_view s,
                          const StrToStrMapping& replacements) {
  auto subs = strings_internal::FindSubstitutions(s, replacements);
  std::string result;
  result.reserve(s.size());
  strings_internal::ApplySubstitutions(s, &subs, &result);
  return result;
}